

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenEnumDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  EnumDef *this_00;
  pointer pcVar2;
  long lVar3;
  EnumVal *ev;
  long *plVar4;
  size_type *psVar5;
  string constant;
  string local_58;
  string local_38;
  
  this_00 = (field->value).type.enum_def;
  if (this_00 != (EnumDef *)0x0) {
    BVar1 = (field->value).type.base_type;
    if ((BVar1 == BASE_TYPE_VECTOR64) || (BVar1 == BASE_TYPE_VECTOR)) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"0","");
    }
    else {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      pcVar2 = (field->value).constant._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,pcVar2,pcVar2 + (field->value).constant._M_string_length);
    }
    ev = EnumDef::FindByValue(this_00,&local_38);
    if (ev == (EnumVal *)0x0) {
      IdlNamer::LegacySwiftVariant_abi_cxx11_
                (&local_58,&this->namer_,
                 *(this_00->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x37c1d6);
    }
    else {
      IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_58,&this->namer_,ev);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x37c1d6);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("value.type.enum_def",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_swift.cpp"
                ,0x726,
                "std::string flatbuffers::swift::SwiftGenerator::GenEnumDefaultValue(const FieldDef &)"
               );
}

Assistant:

std::string GenEnumDefaultValue(const FieldDef &field) {
    const auto &value = field.value;
    FLATBUFFERS_ASSERT(value.type.enum_def);
    const auto &enum_def = *value.type.enum_def;
    // Vector of enum defaults are always "[]" which never works.
    const std::string constant = IsVector(value.type) ? "0" : value.constant;
    const auto enum_val = enum_def.FindByValue(constant);
    if (enum_val) {
      return "." + namer_.LegacySwiftVariant(*enum_val);
    } else {
      const auto &ev = **enum_def.Vals().begin();
      return "." + namer_.LegacySwiftVariant(ev);
    }
  }